

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

GlobalObject * Js::GlobalObject::New(ScriptContext *scriptContext)

{
  DynamicType *this;
  Recycler *pRVar1;
  GlobalObject *this_00;
  RecyclerWeakReference<Js::DynamicObject> *instance;
  TrackAllocData local_50;
  GlobalObject *local_28;
  GlobalObject *globalObject;
  DynamicType *globalType;
  SimpleDictionaryTypeHandler *globalTypeHandler;
  ScriptContext *scriptContext_local;
  
  globalTypeHandler = (SimpleDictionaryTypeHandler *)scriptContext;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  globalType = (DynamicType *)
               SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
               New(pRVar1,0x34,0x34,0x68,false,false);
  globalObject = (GlobalObject *)
                 DynamicType::New((ScriptContext *)globalTypeHandler,TypeIds_GlobalObject,
                                  (RecyclableObject *)0x0,(JavascriptMethod)0x0,
                                  (DynamicTypeHandler *)globalType,false,false);
  pRVar1 = ScriptContext::GetRecycler((ScriptContext *)globalTypeHandler);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0x1a0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
             ,0x1b);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  this_00 = (GlobalObject *)new<Memory::Recycler>(0x68,pRVar1,0x446fd0,0);
  GlobalObject(this_00,(DynamicType *)globalObject,(ScriptContext *)globalTypeHandler);
  this = globalType;
  local_28 = this_00;
  pRVar1 = ScriptContext::GetRecycler((ScriptContext *)globalTypeHandler);
  instance = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicObject>
                       (pRVar1,(DynamicObject *)local_28);
  DynamicTypeHandler::SetSingletonInstanceIfNeeded((DynamicTypeHandler *)this,instance);
  return local_28;
}

Assistant:

GlobalObject * GlobalObject::New(ScriptContext * scriptContext)
    {
        SimpleDictionaryTypeHandler* globalTypeHandler = SimpleDictionaryTypeHandler::New(
            scriptContext->GetRecycler(), InitialCapacity, InlineSlotCapacity, sizeof(Js::GlobalObject));

        DynamicType* globalType = DynamicType::New(
            scriptContext, TypeIds_GlobalObject, nullptr, nullptr, globalTypeHandler);

        GlobalObject* globalObject = RecyclerNewPlus(scriptContext->GetRecycler(),
            sizeof(Var) * InlineSlotCapacity, GlobalObject, globalType, scriptContext);

#if ENABLE_FIXED_FIELDS
        globalTypeHandler->SetSingletonInstanceIfNeeded(scriptContext->GetRecycler()->CreateWeakReferenceHandle<DynamicObject>(globalObject));
#endif

        return globalObject;
    }